

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRP.cpp
# Opt level: O0

void __thiscall GLRP::loadParser(GLRP *this)

{
  bool bVar1;
  ostream *poVar2;
  CFG *this_00;
  GLRParser *this_01;
  CFG *cfg;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  string startS;
  vector<Production_*,_std::allocator<Production_*>_> productionsP;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsT;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminalsV;
  GLRP *this_local;
  
  bVar1 = isLoaded(this);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Creating CFG...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&terminalsT.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Production_*,_std::allocator<Production_*>_>::vector
              ((vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8));
    std::__cxx11::string::string((string *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"grammar/Simple Grammar/cpp.json",&local_99);
    readJson(&local_98,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&terminalsT.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8),
             (string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    this_00 = (CFG *)operator_new(0x68);
    CFG::CFG(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&terminalsT.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8),
             (string *)local_78);
    poVar2 = std::operator<<((ostream *)&std::cout,"Creating GLRParser...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"This might take a while...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_01 = (GLRParser *)operator_new(0xa8);
    GLRParser::GLRParser(this_01,this_00,false);
    setGlrParser(this,this_01);
    poVar2 = std::operator<<((ostream *)&std::cout,"Done");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    setLoaded(this,true);
    std::__cxx11::string::~string((string *)local_78);
    std::vector<Production_*,_std::allocator<Production_*>_>::~vector
              ((vector<Production_*,_std::allocator<Production_*>_> *)((long)&startS.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&productionsP.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&terminalsT.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void GLRP::loadParser() {
    if (isLoaded())
        return;

    std::cout << "Creating CFG..." << std::endl;

    // Generate a CFG for the c++ language
    std::vector<std::string> nonTerminalsV;
    std::vector<std::string> terminalsT;
    std::vector<Production *> productionsP;
    std::string startS;

    readJson("grammar/Simple Grammar/cpp.json", nonTerminalsV, terminalsT, productionsP, startS);

    CFG *cfg = new CFG(nonTerminalsV, terminalsT, productionsP, startS);

    std::cout << "Creating GLRParser..." << std::endl;
    std::cout << "This might take a while..." << std::endl;
    std::cout << "Hint: The parser has to be created only once per runtime. Once generated, all feautures will work a lot faster." << std::endl;
    // Generate a GLRParser
    setGlrParser(new GLRParser(cfg, VERBOSE));

//    glrParser->toDot("output/GLRParser202500126.dot");

    std::cout << "Done" << std::endl;

    setLoaded(true);

}